

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

Simplex_handle __thiscall
Gudhi::Simplex_tree<Low_options>::find_simplex
          (Simplex_tree<Low_options> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *simplex)

{
  long *in_RDX;
  Siblings *pSVar1;
  long lVar2;
  pointer local_30;
  
  pSVar1 = (Siblings *)
           &simplex[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  lVar2 = *in_RDX;
  do {
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_boost::container::dtl::select1st<unsigned_char>,_std::less<unsigned_char>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_>_>
    ::find((flat_tree<boost::container::dtl::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_boost::container::dtl::select1st<unsigned_char>,_std::less<unsigned_char>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_>_>
            *)&local_30,(key_type *)&pSVar1->members_);
    if (local_30 ==
        (pSVar1->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
        (pSVar1->members_).m_flat_tree.m_data.m_seq.m_holder.m_size) break;
    lVar2 = lVar2 + 1;
    if (lVar2 == in_RDX[1]) goto LAB_00110fe7;
    pSVar1 = (local_30->second).children_;
  } while (pSVar1->parent_ == local_30->first);
  local_30 = (pointer)0x0;
LAB_00110fe7:
  (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)local_30;
  return (Simplex_handle)
         (pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>
          *)this;
}

Assistant:

Simplex_handle find_simplex(const std::vector<Vertex_handle> & simplex) const {
    Siblings const* tmp_sib = &root_;
    Dictionary_const_it tmp_dit;
    auto vi = simplex.begin();
    if constexpr (Options::contiguous_vertices && !Options::stable_simplex_handles) {
      // Equivalent to the first iteration of the normal loop
      GUDHI_CHECK(contiguous_vertices(), "non-contiguous vertices");
      Vertex_handle v = *vi++;
      if(v < 0 || v >= static_cast<Vertex_handle>(root_.members_.size()))
        return null_simplex();
      tmp_dit = root_.members_.begin() + v;
      if (vi == simplex.end())
        return tmp_dit;
      if (!has_children(tmp_dit))
        return null_simplex();
      tmp_sib = tmp_dit->second.children();
    }
    for (;;) {
      tmp_dit = tmp_sib->members_.find(*vi++);
      if (tmp_dit == tmp_sib->members_.end())
        return null_simplex();
      if (vi == simplex.end())
        return tmp_dit;
      if (!has_children(tmp_dit))
        return null_simplex();
      tmp_sib = tmp_dit->second.children();
    }
  }